

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxBoxCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
cbtBoxBoxCollisionAlgorithm::cbtBoxBoxCollisionAlgorithm
          (cbtBoxBoxCollisionAlgorithm *this,cbtPersistentManifold *mf,
          cbtCollisionAlgorithmConstructionInfo *ci,cbtCollisionObjectWrapper *body0Wrap,
          cbtCollisionObjectWrapper *body1Wrap)

{
  cbtDispatcher *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  
  cbtActivatingCollisionAlgorithm::cbtActivatingCollisionAlgorithm
            (&this->super_cbtActivatingCollisionAlgorithm,ci,body0Wrap,body1Wrap);
  (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
  _vptr_cbtCollisionAlgorithm = (_func_int **)&PTR__cbtBoxBoxCollisionAlgorithm_00b48d60;
  this->m_ownManifold = false;
  this->m_manifoldPtr = mf;
  if (mf == (cbtPersistentManifold *)0x0) {
    pcVar1 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.m_dispatcher;
    iVar2 = (*pcVar1->_vptr_cbtDispatcher[6])
                      (pcVar1,body0Wrap->m_collisionObject,body1Wrap->m_collisionObject);
    if ((char)iVar2 != '\0') {
      pcVar1 = (this->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
               m_dispatcher;
      iVar2 = (*pcVar1->_vptr_cbtDispatcher[3])
                        (pcVar1,body0Wrap->m_collisionObject,body1Wrap->m_collisionObject);
      this->m_manifoldPtr = (cbtPersistentManifold *)CONCAT44(extraout_var,iVar2);
      this->m_ownManifold = true;
    }
  }
  return;
}

Assistant:

cbtBoxBoxCollisionAlgorithm::cbtBoxBoxCollisionAlgorithm(cbtPersistentManifold* mf, const cbtCollisionAlgorithmConstructionInfo& ci, const cbtCollisionObjectWrapper* body0Wrap, const cbtCollisionObjectWrapper* body1Wrap)
	: cbtActivatingCollisionAlgorithm(ci, body0Wrap, body1Wrap),
	  m_ownManifold(false),
	  m_manifoldPtr(mf)
{
	if (!m_manifoldPtr && m_dispatcher->needsCollision(body0Wrap->getCollisionObject(), body1Wrap->getCollisionObject()))
	{
		m_manifoldPtr = m_dispatcher->getNewManifold(body0Wrap->getCollisionObject(), body1Wrap->getCollisionObject());
		m_ownManifold = true;
	}
}